

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::FindNextProperty
          (DictionaryTypeHandlerBase<unsigned_short> *this,ScriptContext *scriptContext,
          PropertyIndex *index,JavascriptString **propertyStringName,PropertyId *propertyId,
          PropertyAttributes *attributes,Type *type,DynamicType *typeToEnumerate,
          EnumeratorFlags flags,DynamicObject *instance,PropertyValueInfo *info)

{
  ushort uVar1;
  DictionaryPropertyDescriptor<unsigned_short> DVar2;
  PropertyRecord *this_00;
  code *pcVar3;
  PropertyAttributes PVar4;
  bool bVar5;
  EnumeratorFlags EVar6;
  unsigned_short propIndex;
  int iVar7;
  PropertyId PVar8;
  undefined4 *puVar9;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar10;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar11;
  PropertyRecord **ppPVar12;
  PropertyString *this_01;
  PolymorphicInlineCache *polymorphicInlineCache;
  unsigned_short dataSlot;
  PropertyString *propertyString;
  PropertyRecord *propertyRecord;
  DictionaryPropertyDescriptor<unsigned_short> DStack_48;
  PropertyAttributes attribs;
  DictionaryPropertyDescriptor<unsigned_short> descriptor;
  PropertyAttributes *attributes_local;
  PropertyId *propertyId_local;
  JavascriptString **propertyStringName_local;
  PropertyIndex *index_local;
  ScriptContext *scriptContext_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  descriptor = (DictionaryPropertyDescriptor<unsigned_short>)attributes;
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x70,"(propertyStringName)","propertyStringName");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x71,"(propertyId)","propertyId");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x72,"(type)","type");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  do {
    uVar1 = *index;
    pBVar10 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
              ::operator->(&this->propertyMap);
    iVar7 = JsUtil::
            BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Count(pBVar10);
    if (iVar7 <= (int)(uint)uVar1) {
      PropertyValueInfo::SetNoCache(info,&instance->super_RecyclableObject);
      return 0;
    }
    pBVar10 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
              ::operator->(&this->propertyMap);
    pDVar11 = JsUtil::
              BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetValueAt(pBVar10,(uint)*index);
    DVar2 = *pDVar11;
    DStack_48.Attributes = DVar2.Attributes;
    PVar4 = DStack_48.Attributes;
    DStack_48 = DVar2;
    if (((ulong)DVar2 & 0x800) == 0) {
      EVar6 = Js::operator&(flags,EnumNonEnumerable);
      bVar5 = operator!(EVar6);
      if (((!bVar5) || (((ulong)DVar2 & 0x100) != 0)) &&
         ((((ulong)DVar2 & 0x1000) == 0 ||
          (bVar5 = DictionaryPropertyDescriptor<unsigned_short>::HasNonLetConstGlobal
                             (&stack0xffffffffffffffb8), bVar5)))) {
        pBVar10 = Memory::
                  WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                  ::operator->(&this->propertyMap);
        ppPVar12 = JsUtil::
                   BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::GetKeyAt(pBVar10,(uint)*index);
        this_00 = *ppPVar12;
        EVar6 = Js::operator&(flags,EnumSymbols);
        bVar5 = operator!(EVar6);
        if ((!bVar5) || (bVar5 = PropertyRecord::IsSymbol(this_00), !bVar5)) {
          if (descriptor != (DictionaryPropertyDescriptor<unsigned_short>)0x0) {
            *(PropertyAttributes *)descriptor = PVar4;
          }
          PVar8 = PropertyRecord::GetPropertyId(this_00);
          *propertyId = PVar8;
          this_01 = ScriptContext::GetPropertyString(scriptContext,*propertyId);
          *propertyStringName = &this_01->super_JavascriptString;
          propIndex = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>
                                (&stack0xffffffffffffffb8);
          if (((propIndex == 0xffff) || (((ulong)DVar2 & 0x400) == 0)) ||
             ((DynamicType *)type != typeToEnumerate)) {
            PropertyValueInfo::SetNoCache(info,&instance->super_RecyclableObject);
          }
          else {
            polymorphicInlineCache = PropertyString::GetLdElemInlineCache(this_01);
            PropertyValueInfo::SetCacheInfo<Js::PropertyString>
                      (info,this_01,polymorphicInlineCache,false);
            SetPropertyValueInfo
                      (this,info,&instance->super_RecyclableObject,propIndex,
                       &stack0xffffffffffffffb8);
          }
          return 1;
        }
      }
    }
    *index = *index + 1;
  } while( true );
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::FindNextProperty(ScriptContext* scriptContext, PropertyIndex& index, JavascriptString** propertyStringName,
        PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);

        for (; index < propertyMap->Count(); ++index)
        {
            DictionaryPropertyDescriptor<T> descriptor = propertyMap->GetValueAt(index);
            PropertyAttributes attribs = descriptor.Attributes;

            if (!(attribs & PropertyDeleted) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (attribs & PropertyEnumerable)) &&
                (!(attribs & PropertyLetConstGlobal) || descriptor.HasNonLetConstGlobal()))
            {
                const PropertyRecord* propertyRecord = propertyMap->GetKeyAt(index);

                // Skip this property if it is a symbol and we are not including symbol properties
                if (!(flags & EnumeratorFlags::EnumSymbols) && propertyRecord->IsSymbol())
                {
                    continue;
                }

                // Pass back attributes of this property so caller can use them if it needs
                if (attributes != nullptr)
                {
                    *attributes = attribs;
                }

                *propertyId = propertyRecord->GetPropertyId();
                PropertyString* propertyString = scriptContext->GetPropertyString(*propertyId);
                *propertyStringName = propertyString;
                T dataSlot = descriptor.template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots && (attribs & PropertyWritable) && type == typeToEnumerate)
                {
                    PropertyValueInfo::SetCacheInfo(info, propertyString, propertyString->GetLdElemInlineCache(), false);
                    SetPropertyValueInfo(info, instance, dataSlot, &descriptor);
                }
                else
                {
                    PropertyValueInfo::SetNoCache(info, instance);
                }
                return TRUE;
            }
        }
        PropertyValueInfo::SetNoCache(info, instance);

        return FALSE;
    }